

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage3_ssse3(__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  
  alVar3 = *x;
  alVar4 = x[1];
  alVar1 = x[2];
  alVar2 = x[3];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[8]);
  *x = alVar5;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[8]);
  x[8] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[9]);
  x[1] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[9]);
  x[9] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[2] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[10] = alVar3;
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[0xb]);
  x[3] = alVar3;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[0xb]);
  x[0xb] = alVar3;
  alVar3 = x[4];
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0xc]);
  x[4] = alVar4;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0xc]);
  x[0xc] = alVar3;
  alVar3 = x[5];
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0xd]);
  x[5] = alVar4;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0xd]);
  x[0xd] = alVar3;
  alVar3 = x[6];
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0xe]);
  x[6] = alVar4;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0xe]);
  x[0xe] = alVar3;
  alVar3 = x[7];
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0xf]);
  x[7] = alVar4;
  alVar3 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0xf]);
  x[0xf] = alVar3;
  return;
}

Assistant:

static inline void iadst16_stage3_ssse3(__m128i *x) {
  btf_16_adds_subs_sse2(x[0], x[8]);
  btf_16_adds_subs_sse2(x[1], x[9]);
  btf_16_adds_subs_sse2(x[2], x[10]);
  btf_16_adds_subs_sse2(x[3], x[11]);
  btf_16_adds_subs_sse2(x[4], x[12]);
  btf_16_adds_subs_sse2(x[5], x[13]);
  btf_16_adds_subs_sse2(x[6], x[14]);
  btf_16_adds_subs_sse2(x[7], x[15]);
}